

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_column_writer.cpp
# Opt level: O2

void __thiscall
duckdb::PrimitiveColumnWriter::BeginWrite(PrimitiveColumnWriter *this,ColumnWriterState *state_p)

{
  undefined8 uVar1;
  undefined8 uVar2;
  _Bit_type *p_Var3;
  undefined8 uVar4;
  reference pvVar5;
  Allocator *args;
  ulong __n;
  _Head_base<0UL,_duckdb::MemoryStream_*,_false> local_270;
  pointer *local_268;
  pointer *local_260;
  uint64_t local_258;
  undefined1 local_250 [504];
  undefined1 local_58 [16];
  
  (*(this->super_ColumnWriter)._vptr_ColumnWriter[0xb])(local_250,this);
  uVar4 = local_250._0_8_;
  local_250._0_8_ = (long *)0x0;
  p_Var3 = state_p[1].is_empty.super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
           super__Bit_iterator_base._M_p;
  state_p[1].is_empty.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)uVar4;
  if (p_Var3 != (_Bit_type *)0x0) {
    (**(code **)(*p_Var3 + 8))();
    if ((long *)local_250._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_250._0_8_ + 8))();
    }
  }
  local_268 = &state_p[1].definition_levels.
               super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  local_260 = &state_p[1].repetition_levels.
               super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  __n = 0;
  do {
    if ((ulong)(((long)state_p[1].repetition_levels.
                       super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start -
                (long)state_p[1].definition_levels.
                      super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) / 0x28) <= __n) {
LAB_01e59bf8:
      NextPage(this,(PrimitiveColumnWriterState *)state_p);
      return;
    }
    pvVar5 = vector<duckdb::PageInformation,_true>::get<true>
                       ((vector<duckdb::PageInformation,_true> *)local_268,__n);
    if (pvVar5->row_count == 0) {
      vector<duckdb::PageInformation,_true>::erase_at
                ((vector<duckdb::PageInformation,_true> *)local_268,__n);
      goto LAB_01e59bf8;
    }
    PageWriteInformation::PageWriteInformation((PageWriteInformation *)local_250);
    local_250._16_4_ = 0;
    local_250._8_4_ = DATA_PAGE;
    local_250._12_4_ = 0;
    local_250[0x1c8] = (_PageHeader__isset)((byte)local_250[0x1c8] | 2);
    local_250._32_4_ = (undefined4)pvVar5->row_count;
    local_250._36_4_ = (*(this->super_ColumnWriter)._vptr_ColumnWriter[10])(this,state_p);
    local_250._40_4_ = RLE;
    local_250._44_4_ = RLE;
    args = Allocator::Get(((this->super_ColumnWriter).writer)->context);
    local_258 = NextPowerOfTwo(pvVar5->estimated_page_size);
    if (local_258 < 0x201) {
      local_258 = 0x200;
    }
    make_uniq<duckdb::MemoryStream,duckdb::Allocator&,unsigned_long>
              ((duckdb *)&local_270,args,&local_258);
    uVar4 = local_250._464_8_;
    local_250._464_8_ = local_270._M_head_impl;
    local_270._M_head_impl = (MemoryStream *)0x0;
    if ((_Head_base<0UL,_duckdb::MemoryStream_*,_false>)uVar4 !=
        (_Head_base<0UL,_duckdb::MemoryStream_*,_false>)0x0) {
      (*((WriteStream *)uVar4)->_vptr_WriteStream[2])();
      if (local_270._M_head_impl != (MemoryStream *)0x0) {
        (*((local_270._M_head_impl)->super_WriteStream)._vptr_WriteStream[2])();
      }
    }
    uVar1 = pvVar5->row_count;
    uVar2 = pvVar5->empty_count;
    local_250._496_4_ = (int)uVar1;
    local_250._488_8_ = uVar2;
    local_250._500_4_ = (int)((ulong)uVar1 >> 0x20);
    (*(this->super_ColumnWriter)._vptr_ColumnWriter[0xc])(&local_270,this,state_p,__n);
    uVar4 = local_250._472_8_;
    local_250._472_8_ = local_270._M_head_impl;
    local_270._M_head_impl = (MemoryStream *)0x0;
    if ((ColumnWriterPageState *)uVar4 != (ColumnWriterPageState *)0x0) {
      (*(*(_func_int ***)uVar4)[1])();
      if (local_270._M_head_impl != (MemoryStream *)0x0) {
        (*((local_270._M_head_impl)->super_WriteStream)._vptr_WriteStream[1])();
      }
    }
    local_58 = (undefined1  [16])0x0;
    ::std::vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>::
    emplace_back<duckdb::PageWriteInformation>
              ((vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>
                *)local_260,(PageWriteInformation *)local_250);
    PageWriteInformation::~PageWriteInformation((PageWriteInformation *)local_250);
    __n = __n + 1;
  } while( true );
}

Assistant:

void PrimitiveColumnWriter::BeginWrite(ColumnWriterState &state_p) {
	auto &state = state_p.Cast<PrimitiveColumnWriterState>();

	// set up the page write info
	state.stats_state = InitializeStatsState();
	for (idx_t page_idx = 0; page_idx < state.page_info.size(); page_idx++) {
		auto &page_info = state.page_info[page_idx];
		if (page_info.row_count == 0) {
			D_ASSERT(page_idx + 1 == state.page_info.size());
			state.page_info.erase_at(page_idx);
			break;
		}
		PageWriteInformation write_info;
		// set up the header
		auto &hdr = write_info.page_header;
		hdr.compressed_page_size = 0;
		hdr.uncompressed_page_size = 0;
		hdr.type = PageType::DATA_PAGE;
		hdr.__isset.data_page_header = true;

		hdr.data_page_header.num_values = UnsafeNumericCast<int32_t>(page_info.row_count);
		hdr.data_page_header.encoding = GetEncoding(state);
		hdr.data_page_header.definition_level_encoding = Encoding::RLE;
		hdr.data_page_header.repetition_level_encoding = Encoding::RLE;

		write_info.temp_writer = make_uniq<MemoryStream>(
		    Allocator::Get(writer.GetContext()),
		    MaxValue<idx_t>(NextPowerOfTwo(page_info.estimated_page_size), MemoryStream::DEFAULT_INITIAL_CAPACITY));
		write_info.write_count = page_info.empty_count;
		write_info.max_write_count = page_info.row_count;
		write_info.page_state = InitializePageState(state, page_idx);

		write_info.compressed_size = 0;
		write_info.compressed_data = nullptr;

		state.write_info.push_back(std::move(write_info));
	}

	// start writing the first page
	NextPage(state);
}